

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTF2Exporter.cpp
# Opt level: O3

void __thiscall Assimp::glTF2Exporter::ExportMeshes(glTF2Exporter *this)

{
  float fVar1;
  undefined8 uVar2;
  Asset *pAVar3;
  aiMesh **ppaVar4;
  aiMesh *paVar5;
  pointer pRVar6;
  iterator iVar7;
  Skin *pSVar8;
  Mesh *pMVar9;
  undefined8 *puVar10;
  iterator __position;
  pointer puVar11;
  pointer paVar12;
  pointer paVar13;
  uint n;
  vector<glTF2::Skin_*,_std::allocator<glTF2::Skin_*>_> *pvVar14;
  aiScene *paVar15;
  vector<glTF2::Mesh_*,_std::allocator<glTF2::Mesh_*>_> *pvVar16;
  long lVar17;
  size_t sVar18;
  vector<glTF2::Accessor_*,_std::allocator<glTF2::Accessor_*>_> *pvVar19;
  ulong uVar20;
  void *data;
  element_type *peVar21;
  int iVar22;
  ulong uVar23;
  long lVar24;
  pointer ppMVar25;
  uint j;
  Node *pNVar26;
  undefined4 uVar27;
  undefined8 unaff_RBP;
  ulong uVar28;
  uint uVar29;
  ulong uVar30;
  uint uVar31;
  aiVector3D *paVar32;
  int i;
  uint indexColorChannel;
  float fVar33;
  float fVar34;
  float fVar35;
  Ref<glTF2::Buffer> RVar36;
  Ref<glTF2::Skin> RVar37;
  Ref<glTF2::Mesh> RVar38;
  Ref<glTF2::Accessor> RVar39;
  vector<unsigned_int,_std::allocator<unsigned_int>_> indices;
  string name;
  Ref<glTF2::Buffer> local_178;
  void *local_168;
  vector<glTF2::Skin_*,_std::allocator<glTF2::Skin_*>_> *local_160;
  ulong local_158;
  string skinName;
  Ref<glTF2::Mesh> local_130;
  Ref<glTF2::Skin> local_120;
  ulong local_110;
  vector<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_> inverseBindMatricesData;
  string meshId;
  Ref<glTF2::Accessor> local_d0;
  Ref<glTF2::Accessor> local_c0;
  string local_b0;
  string bufferIdPrefix;
  string bufferId;
  string fname;
  
  std::__cxx11::string::string((string *)&fname,this->mFilename,(allocator *)&bufferIdPrefix);
  std::__cxx11::string::rfind((char *)&fname,0x6a4d90,0xffffffffffffffff);
  std::__cxx11::string::substr((ulong)&bufferIdPrefix,(ulong)&fname);
  pAVar3 = (this->mAsset).super___shared_ptr<glTF2::Asset,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  skinName._M_dataplus._M_p = (pointer)&skinName.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&skinName,"");
  glTF2::Asset::FindUniqueID(&bufferId,pAVar3,&skinName,bufferIdPrefix._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)skinName._M_dataplus._M_p != &skinName.field_2) {
    operator_delete(skinName._M_dataplus._M_p);
  }
  peVar21 = (this->mAsset).super___shared_ptr<glTF2::Asset,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_178.vector = (peVar21->mBodyBuffer).vector;
  local_178.index = (peVar21->mBodyBuffer).index;
  if (local_178.vector == (vector<glTF2::Buffer_*,_std::allocator<glTF2::Buffer_*>_> *)0x0) {
    RVar36 = glTF2::LazyDict<glTF2::Buffer>::Create(&peVar21->buffers,bufferId._M_dataplus._M_p);
    local_178.vector = RVar36.vector;
    local_178.index = RVar36.index;
  }
  uVar23 = (ulong)this->mScene->mNumMeshes;
  if (uVar23 == 0) {
    uVar27 = 0;
  }
  else {
    ppaVar4 = this->mScene->mMeshes;
    paVar5 = *ppaVar4;
    if (paVar5->mBones != (aiBone **)0x0) {
      unaff_RBP = CONCAT71((int7)((ulong)unaff_RBP >> 8),1);
      uVar27 = (undefined4)unaff_RBP;
      if (paVar5->mNumBones != 0) goto LAB_00376227;
    }
    uVar20 = 1;
    do {
      uVar30 = uVar20;
      if (uVar23 == uVar30) break;
      paVar5 = ppaVar4[uVar30];
      uVar20 = uVar30 + 1;
    } while ((paVar5->mBones == (aiBone **)0x0) || (paVar5->mNumBones == 0));
    uVar27 = (undefined4)CONCAT71((int7)((ulong)unaff_RBP >> 8),uVar30 < uVar23);
  }
LAB_00376227:
  local_120.vector = (vector<glTF2::Skin_*,_std::allocator<glTF2::Skin_*>_> *)0x0;
  local_120.index = 0;
  pAVar3 = (this->mAsset).super___shared_ptr<glTF2::Asset,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  name._M_dataplus._M_p = (pointer)&name.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&name,"skin","");
  glTF2::Asset::FindUniqueID(&skinName,pAVar3,&name,"skin");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)name._M_dataplus._M_p != &name.field_2) {
    operator_delete(name._M_dataplus._M_p);
  }
  inverseBindMatricesData.
  super__Vector_base<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  inverseBindMatricesData.
  super__Vector_base<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  inverseBindMatricesData.
  super__Vector_base<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_168 = (void *)CONCAT44(local_168._4_4_,uVar27);
  if ((char)uVar27 == '\0') {
    local_110 = 0;
    local_160 = (vector<glTF2::Skin_*,_std::allocator<glTF2::Skin_*>_> *)0x0;
  }
  else {
    RVar37 = glTF2::LazyDict<glTF2::Skin>::Create
                       (&((this->mAsset).
                          super___shared_ptr<glTF2::Asset,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                         skins,skinName._M_dataplus._M_p);
    pvVar14 = RVar37.vector;
    local_120.index = RVar37.index;
    uVar23 = (ulong)local_120.index;
    local_120.vector = pvVar14;
    std::__cxx11::string::_M_assign
              ((string *)
               &(pvVar14->super__Vector_base<glTF2::Skin_*,_std::allocator<glTF2::Skin_*>_>)._M_impl
                .super__Vector_impl_data._M_start[RVar37._8_8_ & 0xffffffff]->name);
    local_160 = pvVar14;
    local_110 = uVar23;
  }
  paVar15 = this->mScene;
  if (paVar15->mNumMeshes == 0) {
LAB_00376858:
    paVar13 = inverseBindMatricesData.
              super__Vector_base<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_>._M_impl
              .super__Vector_impl_data._M_finish;
    paVar12 = inverseBindMatricesData.
              super__Vector_base<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_>._M_impl
              .super__Vector_impl_data._M_start;
    if ((char)local_168 != '\0') {
      uVar23 = (long)inverseBindMatricesData.
                     super__Vector_base<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)inverseBindMatricesData.
                     super__Vector_base<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_>.
                     _M_impl.super__Vector_impl_data._M_start >> 6;
      data = operator_new__(-(ulong)(uVar23 >> 0x3a != 0) |
                            (long)inverseBindMatricesData.
                                  super__Vector_base<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)inverseBindMatricesData.
                                  super__Vector_base<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
      local_168 = data;
      if (paVar13 != paVar12) {
        uVar20 = 1;
        uVar30 = 0;
        do {
          uVar28 = uVar20;
          CopyValue(paVar12 + uVar30,(mat4 *)(uVar30 * 0x40 + (long)data));
          uVar20 = (ulong)((int)uVar28 + 1);
          uVar30 = uVar28;
        } while (uVar28 < uVar23);
      }
      RVar39 = ExportData((this->mAsset).
                          super___shared_ptr<glTF2::Asset,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                          &skinName,&local_178,uVar23,data,MAT4,MAT4,ComponentType_FLOAT,false);
      local_158 = local_110 & 0xffffffff;
      if (RVar39.vector != (vector<glTF2::Accessor_*,_std::allocator<glTF2::Accessor_*>_> *)0x0) {
        pSVar8 = (local_160->super__Vector_base<glTF2::Skin_*,_std::allocator<glTF2::Skin_*>_>).
                 _M_impl.super__Vector_impl_data._M_start[local_158];
        (pSVar8->inverseBindMatrices).vector = RVar39.vector;
        (pSVar8->inverseBindMatrices).index = RVar39.index;
      }
      ((local_160->super__Vector_base<glTF2::Skin_*,_std::allocator<glTF2::Skin_*>_>)._M_impl.
       super__Vector_impl_data._M_start[local_158]->bindShapeMatrix).isPresent = true;
      pSVar8 = (local_160->super__Vector_base<glTF2::Skin_*,_std::allocator<glTF2::Skin_*>_>).
               _M_impl.super__Vector_impl_data._M_start[local_158];
      (pSVar8->bindShapeMatrix).value[0] = 1.0;
      (pSVar8->bindShapeMatrix).value[1] = 0.0;
      (pSVar8->bindShapeMatrix).value[2] = 0.0;
      (pSVar8->bindShapeMatrix).value[3] = 0.0;
      (pSVar8->bindShapeMatrix).value[4] = 0.0;
      (pSVar8->bindShapeMatrix).value[5] = 1.0;
      (pSVar8->bindShapeMatrix).value[6] = 0.0;
      (pSVar8->bindShapeMatrix).value[7] = 0.0;
      (pSVar8->bindShapeMatrix).value[8] = 0.0;
      (pSVar8->bindShapeMatrix).value[9] = 0.0;
      (pSVar8->bindShapeMatrix).value[10] = 1.0;
      (pSVar8->bindShapeMatrix).value[0xb] = 0.0;
      (pSVar8->bindShapeMatrix).value[0xc] = 0.0;
      (pSVar8->bindShapeMatrix).value[0xd] = 0.0;
      (pSVar8->bindShapeMatrix).value[0xe] = 0.0;
      (pSVar8->bindShapeMatrix).value[0xf] = 1.0;
      peVar21 = (this->mAsset).super___shared_ptr<glTF2::Asset,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      meshId._M_dataplus._M_p = (pointer)&(peVar21->nodes).mObjs;
      meshId._M_string_length._0_4_ = 0;
      indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish =
           (pointer)((ulong)indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                            _M_impl.super__Vector_impl_data._M_finish & 0xffffffff00000000);
      ppMVar25 = (peVar21->meshes).mObjs.
                 super__Vector_base<glTF2::Mesh_*,_std::allocator<glTF2::Mesh_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      if ((int)((ulong)((long)*(pointer *)
                               ((long)&(peVar21->meshes).mObjs.
                                       super__Vector_base<glTF2::Mesh_*,_std::allocator<glTF2::Mesh_*>_>
                                       ._M_impl.super__Vector_impl_data + 8) - (long)ppMVar25) >> 3)
          != 0) {
        uVar23 = 0;
        pvVar14 = local_160;
        do {
          pMVar9 = ppMVar25[uVar23];
          lVar17 = *(long *)&(pMVar9->primitives).
                             super__Vector_base<glTF2::Mesh::Primitive,_std::allocator<glTF2::Mesh::Primitive>_>
          ;
          lVar24 = (long)*(pointer *)((long)&pMVar9->primitives + 8) - lVar17;
          if (lVar24 != 0) {
            uVar31 = 1;
            uVar20 = 0;
LAB_003769d6:
            if (*(long *)(lVar17 + 0xb0 + uVar20 * 0x100) ==
                *(long *)(lVar17 + 0xb8 + uVar20 * 0x100)) goto code_r0x003769ec;
            name._M_dataplus._M_p = (pointer)&name.field_2;
            lVar17 = *(long *)&((string *)((long)&pMVar9->super_Object + 0x10))->_M_dataplus;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&name,lVar17,
                       *(size_type *)((long)&pMVar9->super_Object + 0x18) + lVar17);
            local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_b0,name._M_dataplus._M_p,
                       name._M_dataplus._M_p + name._M_string_length);
            FindMeshNode((Ref<glTF2::Node> *)&meshId,(Ref<glTF2::Node> *)&indices,&local_b0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
              operator_delete(local_b0._M_dataplus._M_p);
            }
            puVar11 = indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            puVar10 = *(undefined8 **)
                       &((pvVar14->super__Vector_base<glTF2::Skin_*,_std::allocator<glTF2::Skin_*>_>
                         )._M_impl.super__Vector_impl_data._M_start[local_158]->jointNames).
                        super__Vector_base<glTF2::Ref<glTF2::Node>,_std::allocator<glTF2::Ref<glTF2::Node>_>_>
                        ._M_impl.super__Vector_impl_data;
            pNVar26 = *(Node **)(*(long *)*puVar10 + (ulong)*(uint *)(puVar10 + 1) * 8);
            do {
              local_130.vector =
                   (vector<glTF2::Mesh_*,_std::allocator<glTF2::Mesh_*>_> *)(pNVar26->parent).vector
              ;
              local_130.index = (pNVar26->parent).index;
              pNVar26 = (((_Vector_base<glTF2::Node_*,_std::allocator<glTF2::Node_*>_> *)
                         &(local_130.vector)->
                          super__Vector_base<glTF2::Mesh_*,_std::allocator<glTF2::Mesh_*>_>)->
                        _M_impl).super__Vector_impl_data._M_start[local_130.index];
            } while ((pNVar26->jointName)._M_string_length != 0);
            uVar20 = (ulong)indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                            _M_impl.super__Vector_impl_data._M_finish & 0xffffffff;
            lVar17 = *(long *)(*(long *)indices.
                                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                        ._M_impl.super__Vector_impl_data._M_start + uVar20 * 8);
            __position._M_current = *(Ref<glTF2::Node> **)(lVar17 + 0x120);
            if (__position._M_current == *(Ref<glTF2::Node> **)(lVar17 + 0x128)) {
              std::vector<glTF2::Ref<glTF2::Node>,std::allocator<glTF2::Ref<glTF2::Node>>>::
              _M_realloc_insert<glTF2::Ref<glTF2::Node>const&>
                        ((vector<glTF2::Ref<glTF2::Node>,std::allocator<glTF2::Ref<glTF2::Node>>> *)
                         (lVar17 + 0x118),__position,(Ref<glTF2::Node> *)&local_130);
            }
            else {
              (__position._M_current)->vector =
                   (vector<glTF2::Node_*,_std::allocator<glTF2::Node_*>_> *)local_130.vector;
              *(ulong *)&(__position._M_current)->index = CONCAT44(local_130._12_4_,local_130.index)
              ;
              *(long *)(lVar17 + 0x120) = *(long *)(lVar17 + 0x120) + 0x10;
            }
            lVar17 = *(long *)(*(long *)puVar11 + uVar20 * 8);
            *(uint *)(lVar17 + 0x138) = local_120.index;
            *(vector<glTF2::Skin_*,_std::allocator<glTF2::Skin_*>_> **)(lVar17 + 0x130) =
                 local_120.vector;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)name._M_dataplus._M_p != &name.field_2) {
              operator_delete(name._M_dataplus._M_p);
            }
            peVar21 = (this->mAsset).super___shared_ptr<glTF2::Asset,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr;
            pvVar14 = local_160;
          }
LAB_00376b3b:
          uVar23 = uVar23 + 1;
          ppMVar25 = (peVar21->meshes).mObjs.
                     super__Vector_base<glTF2::Mesh_*,_std::allocator<glTF2::Mesh_*>_>._M_impl.
                     super__Vector_impl_data._M_start;
        } while (uVar23 < ((ulong)((long)*(pointer *)
                                          ((long)&(peVar21->meshes).mObjs.
                                                  super__Vector_base<glTF2::Mesh_*,_std::allocator<glTF2::Mesh_*>_>
                                                  ._M_impl.super__Vector_impl_data + 8) -
                                  (long)ppMVar25) >> 3 & 0xffffffff));
      }
      operator_delete__(local_168);
    }
    if (inverseBindMatricesData.
        super__Vector_base<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(inverseBindMatricesData.
                      super__Vector_base<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)skinName._M_dataplus._M_p != &skinName.field_2) {
      operator_delete(skinName._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)bufferId._M_dataplus._M_p != &bufferId.field_2) {
      operator_delete(bufferId._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)bufferIdPrefix._M_dataplus._M_p != &bufferIdPrefix.field_2) {
      operator_delete(bufferIdPrefix._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)fname._M_dataplus._M_p != &fname.field_2) {
      operator_delete(fname._M_dataplus._M_p);
    }
    return;
  }
  uVar23 = 0;
LAB_00376332:
  paVar5 = paVar15->mMeshes[uVar23];
  std::__cxx11::string::string((string *)&name,(paVar5->mName).data,(allocator *)&meshId);
  local_158 = uVar23;
  glTF2::Asset::FindUniqueID
            (&meshId,(this->mAsset).super___shared_ptr<glTF2::Asset,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr,&name,"mesh");
  RVar38 = glTF2::LazyDict<glTF2::Mesh>::Create
                     (&((this->mAsset).super___shared_ptr<glTF2::Asset,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->meshes,meshId._M_dataplus._M_p);
  pvVar16 = RVar38.vector;
  uVar31 = RVar38.index;
  local_130.vector = pvVar16;
  local_130.index = uVar31;
  std::vector<glTF2::Mesh::Primitive,_std::allocator<glTF2::Mesh::Primitive>_>::resize
            ((vector<glTF2::Mesh::Primitive,_std::allocator<glTF2::Mesh::Primitive>_> *)
             &(((_Vector_base<glTF2::Node_*,_std::allocator<glTF2::Node_*>_> *)
               &pvVar16->super__Vector_base<glTF2::Mesh_*,_std::allocator<glTF2::Mesh_*>_>)->_M_impl
              ).super__Vector_impl_data._M_start[uVar31]->children,1);
  pNVar26 = (((_Vector_base<glTF2::Node_*,_std::allocator<glTF2::Node_*>_> *)
             &pvVar16->super__Vector_base<glTF2::Mesh_*,_std::allocator<glTF2::Mesh_*>_>)->_M_impl).
            super__Vector_impl_data._M_start[uVar31];
  pRVar6 = *(pointer *)
            ((long)&(pNVar26->children).
                    super__Vector_base<glTF2::Ref<glTF2::Node>,_std::allocator<glTF2::Ref<glTF2::Node>_>_>
                    ._M_impl + 8);
  std::__cxx11::string::_M_assign((string *)&(pNVar26->super_Object).name);
  uVar31 = paVar5->mMaterialIndex;
  *(vector<glTF2::Material_*,_std::allocator<glTF2::Material_*>_> **)&pRVar6[-3].index =
       &(((this->mAsset).super___shared_ptr<glTF2::Asset,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        materials).mObjs;
  *(uint *)&pRVar6[-2].vector = uVar31;
  RVar39 = ExportData((this->mAsset).super___shared_ptr<glTF2::Asset,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr,&meshId,&local_178,(ulong)paVar5->mNumVertices,paVar5->mVertices,VEC3,
                      VEC3,ComponentType_FLOAT,false);
  local_c0.vector = RVar39.vector;
  local_c0.index = RVar39.index;
  if (local_c0.vector != (vector<glTF2::Accessor_*,_std::allocator<glTF2::Accessor_*>_> *)0x0) {
    iVar7._M_current = (Ref<glTF2::Accessor> *)pRVar6[-0xf].vector;
    if (iVar7._M_current == *(Ref<glTF2::Accessor> **)&pRVar6[-0xf].index) {
      std::vector<glTF2::Ref<glTF2::Accessor>,std::allocator<glTF2::Ref<glTF2::Accessor>>>::
      _M_realloc_insert<glTF2::Ref<glTF2::Accessor>const&>
                ((vector<glTF2::Ref<glTF2::Accessor>,std::allocator<glTF2::Ref<glTF2::Accessor>>> *)
                 &pRVar6[-0x10].index,iVar7,&local_c0);
    }
    else {
      (iVar7._M_current)->vector = local_c0.vector;
      *(ulong *)&(iVar7._M_current)->index = CONCAT44(local_c0._12_4_,local_c0.index);
      pRVar6[-0xf].vector =
           (vector<glTF2::Node_*,_std::allocator<glTF2::Node_*>_> *)
           ((long)&((pRVar6[-0xf].vector)->
                   super__Vector_base<glTF2::Node_*,_std::allocator<glTF2::Node_*>_>)._M_impl + 0x10
           );
    }
  }
  paVar32 = paVar5->mNormals;
  sVar18 = (size_t)paVar5->mNumVertices;
  if (paVar32 == (aiVector3D *)0x0) {
    paVar32 = (aiVector3D *)0x0;
  }
  else if (paVar5->mNumVertices == 0) {
    sVar18 = 0;
  }
  else {
    lVar17 = 8;
    uVar23 = 0;
    do {
      paVar32 = paVar5->mNormals;
      fVar1 = *(float *)((long)&paVar32->x + lVar17);
      uVar2 = *(undefined8 *)((long)paVar32 + lVar17 + -8);
      fVar33 = (float)uVar2;
      fVar34 = (float)((ulong)uVar2 >> 0x20);
      fVar35 = 1.0 / SQRT(fVar1 * fVar1 + fVar33 * fVar33 + fVar34 * fVar34);
      *(ulong *)((long)paVar32 + lVar17 + -8) = CONCAT44(fVar35 * fVar34,fVar35 * fVar33);
      *(float *)((long)&paVar32->x + lVar17) = fVar1 * fVar35;
      uVar23 = uVar23 + 1;
      sVar18 = (size_t)paVar5->mNumVertices;
      lVar17 = lVar17 + 0xc;
    } while (uVar23 < sVar18);
    paVar32 = paVar5->mNormals;
  }
  RVar39 = ExportData((this->mAsset).super___shared_ptr<glTF2::Asset,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr,&meshId,&local_178,sVar18,paVar32,VEC3,VEC3,ComponentType_FLOAT,false);
  local_d0.vector = RVar39.vector;
  local_d0.index = RVar39.index;
  if (local_d0.vector != (vector<glTF2::Accessor_*,_std::allocator<glTF2::Accessor_*>_> *)0x0) {
    iVar7._M_current = *(Ref<glTF2::Accessor> **)&pRVar6[-0xe].index;
    if (iVar7._M_current == (Ref<glTF2::Accessor> *)pRVar6[-0xd].vector) {
      std::vector<glTF2::Ref<glTF2::Accessor>,std::allocator<glTF2::Ref<glTF2::Accessor>>>::
      _M_realloc_insert<glTF2::Ref<glTF2::Accessor>const&>
                ((vector<glTF2::Ref<glTF2::Accessor>,std::allocator<glTF2::Ref<glTF2::Accessor>>> *)
                 (pRVar6 + -0xe),iVar7,&local_d0);
    }
    else {
      local_d0.vector._0_4_ = RVar39.vector._0_4_;
      local_d0.vector._4_4_ = RVar39.vector._4_4_;
      *(undefined4 *)&(iVar7._M_current)->vector = local_d0.vector._0_4_;
      *(undefined4 *)((long)&(iVar7._M_current)->vector + 4) = local_d0.vector._4_4_;
      (iVar7._M_current)->index = local_d0.index;
      *(undefined4 *)&(iVar7._M_current)->field_0xc = local_d0._12_4_;
      *(long *)&pRVar6[-0xe].index = *(long *)&pRVar6[-0xe].index + 0x10;
    }
  }
  lVar17 = 0;
  do {
    sVar18 = (size_t)paVar5->mNumVertices;
    if (paVar5->mNumVertices != 0 && paVar5->mTextureCoords[lVar17] != (aiVector3D *)0x0) {
      uVar31 = paVar5->mNumUVComponents[lVar17];
      if (1 < uVar31) {
        lVar24 = 4;
        uVar23 = 0;
        do {
          *(float *)((long)&paVar5->mTextureCoords[lVar17]->x + lVar24) =
               1.0 - *(float *)((long)&paVar5->mTextureCoords[lVar17]->x + lVar24);
          uVar23 = uVar23 + 1;
          sVar18 = (size_t)paVar5->mNumVertices;
          lVar24 = lVar24 + 0xc;
        } while (uVar23 < sVar18);
        uVar31 = paVar5->mNumUVComponents[lVar17];
      }
      if (uVar31 != 0) {
        RVar39 = ExportData((this->mAsset).
                            super___shared_ptr<glTF2::Asset,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                            &meshId,&local_178,sVar18,paVar5->mTextureCoords[lVar17],VEC3,
                            (uVar31 != 2) + VEC2,ComponentType_FLOAT,false);
        pvVar19 = RVar39.vector;
        indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish =
             (pointer)CONCAT44(indices.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_finish._4_4_,RVar39.index);
        indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)pvVar19;
        if (pvVar19 != (vector<glTF2::Accessor_*,_std::allocator<glTF2::Accessor_*>_> *)0x0) {
          iVar7._M_current = *(Ref<glTF2::Accessor> **)&pRVar6[-0xb].index;
          if (iVar7._M_current == (Ref<glTF2::Accessor> *)pRVar6[-10].vector) {
            std::vector<glTF2::Ref<glTF2::Accessor>,std::allocator<glTF2::Ref<glTF2::Accessor>>>::
            _M_realloc_insert<glTF2::Ref<glTF2::Accessor>const&>
                      ((vector<glTF2::Ref<glTF2::Accessor>,std::allocator<glTF2::Ref<glTF2::Accessor>>>
                        *)(pRVar6 + -0xb),iVar7,(Ref<glTF2::Accessor> *)&indices);
          }
          else {
            indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start._0_4_ = RVar39.vector._0_4_;
            indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start._4_4_ = RVar39.vector._4_4_;
            *(undefined4 *)&(iVar7._M_current)->vector =
                 indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start._0_4_;
            *(undefined4 *)((long)&(iVar7._M_current)->vector + 4) =
                 indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start._4_4_;
            (iVar7._M_current)->index = RVar39.index;
            *(undefined4 *)&(iVar7._M_current)->field_0xc =
                 indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish._4_4_;
            *(long *)&pRVar6[-0xb].index = *(long *)&pRVar6[-0xb].index + 0x10;
          }
        }
      }
    }
    lVar17 = lVar17 + 1;
  } while (lVar17 != 8);
  uVar23 = 0;
  do {
    uVar20 = 0;
    do {
      if (paVar5->mColors[uVar20] == (aiColor4D *)0x0) goto LAB_00376668;
      uVar20 = uVar20 + 1;
    } while (uVar20 != 8);
    uVar20 = 8;
LAB_00376668:
    if (uVar20 <= uVar23) break;
    RVar39 = ExportData((this->mAsset).super___shared_ptr<glTF2::Asset,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr,&meshId,&local_178,(ulong)paVar5->mNumVertices,
                        paVar5->mColors[uVar23],VEC4,VEC4,ComponentType_FLOAT,false);
    indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)RVar39.vector;
    indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish =
         (pointer)CONCAT44(indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                           _M_impl.super__Vector_impl_data._M_finish._4_4_,RVar39.index);
    if ((vector<glTF2::Accessor_*,_std::allocator<glTF2::Accessor_*>_> *)
        indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start !=
        (vector<glTF2::Accessor_*,_std::allocator<glTF2::Accessor_*>_> *)0x0) {
      iVar7._M_current = (Ref<glTF2::Accessor> *)pRVar6[-9].vector;
      if (iVar7._M_current == *(Ref<glTF2::Accessor> **)&pRVar6[-9].index) {
        std::vector<glTF2::Ref<glTF2::Accessor>,std::allocator<glTF2::Ref<glTF2::Accessor>>>::
        _M_realloc_insert<glTF2::Ref<glTF2::Accessor>const&>
                  ((vector<glTF2::Ref<glTF2::Accessor>,std::allocator<glTF2::Ref<glTF2::Accessor>>>
                    *)&pRVar6[-10].index,iVar7,(Ref<glTF2::Accessor> *)&indices);
      }
      else {
        (iVar7._M_current)->vector =
             (vector<glTF2::Accessor_*,_std::allocator<glTF2::Accessor_*>_> *)
             indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
        *(pointer *)&(iVar7._M_current)->index =
             indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        pRVar6[-9].vector =
             (vector<glTF2::Node_*,_std::allocator<glTF2::Node_*>_> *)
             ((long)&((pRVar6[-9].vector)->
                     super__Vector_base<glTF2::Node_*,_std::allocator<glTF2::Node_*>_>)._M_impl +
             0x10);
      }
    }
    uVar23 = uVar23 + 1;
  } while( true );
  if (paVar5->mNumFaces != 0) {
    indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    uVar31 = paVar5->mFaces->mNumIndices;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
              (&indices,(ulong)(paVar5->mNumFaces * uVar31));
    uVar29 = paVar5->mNumFaces;
    if (uVar29 != 0) {
      lVar17 = 0;
      uVar23 = 0;
      do {
        if (uVar31 != 0) {
          uVar20 = 0;
          do {
            *(uint *)((long)indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                            _M_impl.super__Vector_impl_data._M_start + uVar20 * 4 + lVar17) =
                 paVar5->mFaces[uVar23].mIndices[uVar20];
            uVar20 = uVar20 + 1;
          } while (uVar31 != uVar20);
          uVar29 = paVar5->mNumFaces;
        }
        uVar23 = uVar23 + 1;
        lVar17 = lVar17 + (ulong)uVar31 * 4;
      } while (uVar23 < uVar29);
    }
    RVar39 = ExportData((this->mAsset).super___shared_ptr<glTF2::Asset,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr,&meshId,&local_178,
                        (long)indices.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                        (long)indices.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start >> 2,
                        indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start,SCALAR,SCALAR,
                        ComponentType_UNSIGNED_INT,true);
    *(vector<glTF2::Accessor_*,_std::allocator<glTF2::Accessor_*>_> **)&pRVar6[-4].index =
         RVar39.vector;
    *(uint *)&pRVar6[-3].vector = RVar39.index;
    if (indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
  }
  iVar22 = (uint)(paVar5->mPrimitiveTypes != 2) * 3 + 1;
  if (paVar5->mPrimitiveTypes == 1) {
    iVar22 = 0;
  }
  *(int *)&pRVar6[-0x10].vector = iVar22;
  if ((paVar5->mBones != (aiBone **)0x0) && (paVar5->mNumBones != 0)) {
    ExportSkin((this->mAsset).super___shared_ptr<glTF2::Asset,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
               paVar5,&local_130,&local_178,&local_120,&inverseBindMatricesData);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)meshId._M_dataplus._M_p != &meshId.field_2) {
    operator_delete(meshId._M_dataplus._M_p);
  }
  uVar23 = local_158;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)name._M_dataplus._M_p != &name.field_2) {
    operator_delete(name._M_dataplus._M_p);
  }
  uVar23 = uVar23 + 1;
  paVar15 = this->mScene;
  if (paVar15->mNumMeshes <= uVar23) goto LAB_00376858;
  goto LAB_00376332;
code_r0x003769ec:
  uVar20 = (ulong)uVar31;
  uVar31 = uVar31 + 1;
  if ((ulong)(lVar24 >> 8) <= uVar20) goto LAB_00376b3b;
  goto LAB_003769d6;
}

Assistant:

void glTF2Exporter::ExportMeshes()
{
    typedef decltype(aiFace::mNumIndices) IndicesType;

    std::string fname = std::string(mFilename);
    std::string bufferIdPrefix = fname.substr(0, fname.rfind(".gltf"));
    std::string bufferId = mAsset->FindUniqueID("", bufferIdPrefix.c_str());

    Ref<Buffer> b = mAsset->GetBodyBuffer();
    if (!b) {
       b = mAsset->buffers.Create(bufferId);
    }

    //----------------------------------------
    // Initialize variables for the skin
    bool createSkin = false;
    for (unsigned int idx_mesh = 0; idx_mesh < mScene->mNumMeshes; ++idx_mesh) {
        const aiMesh* aim = mScene->mMeshes[idx_mesh];
        if(aim->HasBones()) {
            createSkin = true;
            break;
        }
    }

    Ref<Skin> skinRef;
    std::string skinName = mAsset->FindUniqueID("skin", "skin");
    std::vector<aiMatrix4x4> inverseBindMatricesData;
    if(createSkin) {
        skinRef = mAsset->skins.Create(skinName);
        skinRef->name = skinName;
    }
    //----------------------------------------

	for (unsigned int idx_mesh = 0; idx_mesh < mScene->mNumMeshes; ++idx_mesh) {
		const aiMesh* aim = mScene->mMeshes[idx_mesh];

        std::string name = aim->mName.C_Str();

        std::string meshId = mAsset->FindUniqueID(name, "mesh");
        Ref<Mesh> m = mAsset->meshes.Create(meshId);
        m->primitives.resize(1);
        Mesh::Primitive& p = m->primitives.back();

        m->name = name;

        p.material = mAsset->materials.Get(aim->mMaterialIndex);

		/******************* Vertices ********************/
        Ref<Accessor> v = ExportData(*mAsset, meshId, b, aim->mNumVertices, aim->mVertices, AttribType::VEC3, AttribType::VEC3, ComponentType_FLOAT);
		if (v) p.attributes.position.push_back(v);

		/******************** Normals ********************/
        // Normalize all normals as the validator can emit a warning otherwise
        if ( nullptr != aim->mNormals) {
            for ( auto i = 0u; i < aim->mNumVertices; ++i ) {
                aim->mNormals[ i ].Normalize();
            }
        }

		Ref<Accessor> n = ExportData(*mAsset, meshId, b, aim->mNumVertices, aim->mNormals, AttribType::VEC3, AttribType::VEC3, ComponentType_FLOAT);
        if (n) p.attributes.normal.push_back(n);

		/************** Texture coordinates **************/
        for (int i = 0; i < AI_MAX_NUMBER_OF_TEXTURECOORDS; ++i) {
			if (!aim->HasTextureCoords(i))
				continue;
			
            // Flip UV y coords
            if (aim -> mNumUVComponents[i] > 1) {
                for (unsigned int j = 0; j < aim->mNumVertices; ++j) {
                    aim->mTextureCoords[i][j].y = 1 - aim->mTextureCoords[i][j].y;
                }
            }

            if (aim->mNumUVComponents[i] > 0) {
                AttribType::Value type = (aim->mNumUVComponents[i] == 2) ? AttribType::VEC2 : AttribType::VEC3;

				Ref<Accessor> tc = ExportData(*mAsset, meshId, b, aim->mNumVertices, aim->mTextureCoords[i], AttribType::VEC3, type, ComponentType_FLOAT, false);
				if (tc) p.attributes.texcoord.push_back(tc);
			}
		}

		/*************** Vertex colors ****************/
		for (unsigned int indexColorChannel = 0; indexColorChannel < aim->GetNumColorChannels(); ++indexColorChannel) {
			Ref<Accessor> c = ExportData(*mAsset, meshId, b, aim->mNumVertices, aim->mColors[indexColorChannel], AttribType::VEC4, AttribType::VEC4, ComponentType_FLOAT, false);
			if (c)
				p.attributes.color.push_back(c);
		}

		/*************** Vertices indices ****************/
		if (aim->mNumFaces > 0) {
			std::vector<IndicesType> indices;
			unsigned int nIndicesPerFace = aim->mFaces[0].mNumIndices;
            indices.resize(aim->mNumFaces * nIndicesPerFace);
            for (size_t i = 0; i < aim->mNumFaces; ++i) {
                for (size_t j = 0; j < nIndicesPerFace; ++j) {
                    indices[i*nIndicesPerFace + j] = IndicesType(aim->mFaces[i].mIndices[j]);
                }
            }

			p.indices = ExportData(*mAsset, meshId, b, indices.size(), &indices[0], AttribType::SCALAR, AttribType::SCALAR, ComponentType_UNSIGNED_INT, true);
		}

        switch (aim->mPrimitiveTypes) {
            case aiPrimitiveType_POLYGON:
                p.mode = PrimitiveMode_TRIANGLES; break; // TODO implement this
            case aiPrimitiveType_LINE:
                p.mode = PrimitiveMode_LINES; break;
            case aiPrimitiveType_POINT:
                p.mode = PrimitiveMode_POINTS; break;
            default: // aiPrimitiveType_TRIANGLE
                p.mode = PrimitiveMode_TRIANGLES;
        }

        /*************** Skins ****************/
        if(aim->HasBones()) {
            ExportSkin(*mAsset, aim, m, b, skinRef, inverseBindMatricesData);
        }
    }

    //----------------------------------------
    // Finish the skin
    // Create the Accessor for skinRef->inverseBindMatrices
    if (createSkin) {
        mat4* invBindMatrixData = new mat4[inverseBindMatricesData.size()];
        for ( unsigned int idx_joint = 0; idx_joint < inverseBindMatricesData.size(); ++idx_joint) {
            CopyValue(inverseBindMatricesData[idx_joint], invBindMatrixData[idx_joint]);
        }

        Ref<Accessor> invBindMatrixAccessor = ExportData(*mAsset, skinName, b,
                static_cast<unsigned int>(inverseBindMatricesData.size()),
            invBindMatrixData, AttribType::MAT4, AttribType::MAT4, ComponentType_FLOAT);
        if (invBindMatrixAccessor) {
            skinRef->inverseBindMatrices = invBindMatrixAccessor;
        }

        // Identity Matrix   =====>  skinRef->bindShapeMatrix
        // Temporary. Hard-coded identity matrix here
        skinRef->bindShapeMatrix.isPresent = true;
        IdentityMatrix4(skinRef->bindShapeMatrix.value);

        // Find nodes that contain a mesh with bones and add "skeletons" and "skin" attributes to those nodes.
        Ref<Node> rootNode = mAsset->nodes.Get(unsigned(0));
        Ref<Node> meshNode;
        for (unsigned int meshIndex = 0; meshIndex < mAsset->meshes.Size(); ++meshIndex) {
            Ref<Mesh> mesh = mAsset->meshes.Get(meshIndex);
            bool hasBones = false;
            for (unsigned int i = 0; i < mesh->primitives.size(); ++i) {
                if (!mesh->primitives[i].attributes.weight.empty()) {
                    hasBones = true;
                    break;
                }
            }
            if (!hasBones) {
                continue;
            }
            std::string meshID = mesh->id;
            FindMeshNode(rootNode, meshNode, meshID);
            Ref<Node> rootJoint = FindSkeletonRootJoint(skinRef);
            meshNode->skeletons.push_back(rootJoint);
            meshNode->skin = skinRef;
        }
        delete[] invBindMatrixData;
    }
}